

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::setCompleter(QLineEdit *this,QCompleter *c)

{
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar1;
  Data *pDVar2;
  bool bVar3;
  QWidget *pQVar4;
  QObject *pQVar5;
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_00->control;
  pDVar2 = (pQVar1->m_completer).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar5 = (QObject *)0x0;
  }
  else {
    pQVar5 = (pQVar1->m_completer).wp.value;
  }
  if (pQVar5 != &c->super_QObject) {
    if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
       ((pQVar1->m_completer).wp.value != (QObject *)0x0)) {
      QLineEditPrivate::disconnectCompleter(this_00);
      QCompleter::setWidget((QCompleter *)(this_00->control->m_completer).wp.value,(QWidget *)0x0);
      pQVar1 = this_00->control;
      pDVar2 = (pQVar1->m_completer).wp.d;
      if (*(QLineEdit **)(*(long *)((pQVar1->m_completer).wp.value + 8) + 0x10) == this) {
        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (pQVar1->m_completer).wp.value;
        }
        if (pQVar5 != (QObject *)0x0) {
          (**(code **)(*(long *)pQVar5 + 0x20))();
        }
      }
    }
    QWidgetLineControl::setCompleter((QWidgetLineControl *)this_00->control,c);
    if (c != (QCompleter *)0x0) {
      pQVar4 = QCompleter::widget(c);
      if (pQVar4 == (QWidget *)0x0) {
        QCompleter::setWidget(c,&this->super_QWidget);
      }
      bVar3 = QWidget::hasFocus(&this->super_QWidget);
      if (bVar3) {
        QLineEditPrivate::connectCompleter(this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void QLineEdit::setCompleter(QCompleter *c)
{
    Q_D(QLineEdit);
    if (c == d->control->completer())
        return;
    if (d->control->completer()) {
        d->disconnectCompleter();
        d->control->completer()->setWidget(nullptr);
        if (d->control->completer()->parent() == this)
            delete d->control->completer();
    }
    d->control->setCompleter(c);
    if (!c)
        return;
    if (c->widget() == nullptr)
        c->setWidget(this);
    if (hasFocus())
        d->connectCompleter();
}